

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmQtAutoGenInitializer.cxx
# Opt level: O2

bool __thiscall cmQtAutoGenInitializer::InitRcc(cmQtAutoGenInitializer *this)

{
  element_type *peVar1;
  bool bVar2;
  long lVar3;
  allocator<char> local_39;
  string local_38;
  
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_38,"rcc",&local_39);
  bVar2 = GetQtExecutable(this,&(this->Rcc).super_GenVarsT,&local_38,false);
  std::__cxx11::string::~string((string *)&local_38);
  if ((bVar2) &&
     (peVar1 = (this->Rcc).super_GenVarsT.ExecutableFeatures.
               super___shared_ptr<cmQtAutoGen::CompilerFeatures,_(__gnu_cxx::_Lock_policy)2>._M_ptr,
     peVar1->Evaluated == false)) {
    if ((this->QtVersion).Major - 5 < 2) {
      lVar3 = std::__cxx11::string::find((char *)&peVar1->HelpOutput,0x460109);
      if (lVar3 == -1) {
        lVar3 = std::__cxx11::string::find((char *)&peVar1->HelpOutput,0x46010a);
        if (lVar3 != -1) {
          std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
          emplace_back<char_const(&)[6]>
                    ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                     &peVar1->ListOptions,(char (*) [6])0x46010a);
        }
      }
      else {
        std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
        emplace_back<char_const(&)[7]>
                  ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                   &peVar1->ListOptions,(char (*) [7])"--list");
      }
    }
    peVar1->Evaluated = true;
  }
  return bVar2;
}

Assistant:

bool cmQtAutoGenInitializer::InitRcc()
{
  // Rcc executable
  {
    if (!this->GetQtExecutable(this->Rcc, "rcc", false)) {
      return false;
    }
    // Evaluate test output on demand
    CompilerFeatures& features = *this->Rcc.ExecutableFeatures;
    if (!features.Evaluated) {
      // Look for list options
      if (this->QtVersion.Major == 5 || this->QtVersion.Major == 6) {
        if (features.HelpOutput.find("--list") != std::string::npos) {
          features.ListOptions.emplace_back("--list");
        } else if (features.HelpOutput.find("-list") != std::string::npos) {
          features.ListOptions.emplace_back("-list");
        }
      }
      // Evaluation finished
      features.Evaluated = true;
    }
  }

  return true;
}